

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O2

int net_tcp4_nonblock_socket(void)

{
  int s;
  int iVar1;
  int iVar2;
  
  s = socket(2,1,0);
  iVar2 = -1;
  if ((s != -1) && (iVar1 = net_tcp4_socket_nonblock(s), iVar2 = s, iVar1 == -1)) {
    close(s);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int net_tcp4_nonblock_socket(void) {
  int s;

  s = socket(AF_INET, SOCK_STREAM, 0);
  if (s == -1)
    return -1;
  if (net_tcp4_socket_nonblock(s) == -1) {
    close(s);
    return -1;
  }
  
  return s;
}